

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sse.c
# Opt level: O2

int64_t aom_sse_c(uint8_t *a,int a_stride,uint8_t *b,int b_stride,int width,int height)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)width;
  if (width < 1) {
    uVar2 = uVar3;
  }
  if (height < 1) {
    height = 0;
  }
  lVar1 = 0;
  for (; (int)uVar3 != height; uVar3 = (ulong)((int)uVar3 + 1)) {
    for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      lVar1 = lVar1 + (ulong)(((uint)a[uVar4] - (uint)b[uVar4]) * ((uint)a[uVar4] - (uint)b[uVar4]))
      ;
    }
    a = a + a_stride;
    b = b + b_stride;
  }
  return lVar1;
}

Assistant:

int64_t aom_sse_c(const uint8_t *a, int a_stride, const uint8_t *b,
                  int b_stride, int width, int height) {
  int y, x;
  int64_t sse = 0;

  for (y = 0; y < height; y++) {
    for (x = 0; x < width; x++) {
      const int32_t diff = abs(a[x] - b[x]);
      sse += diff * diff;
    }

    a += a_stride;
    b += b_stride;
  }
  return sse;
}